

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-object.c
# Opt level: O3

void build_obj_list(wchar_t last,object **list,item_tester tester,olist_detail_t mode)

{
  object **ppoVar1;
  olist_detail_t oVar2;
  _Bool _Var3;
  object *obj;
  char *pcVar4;
  size_t sVar5;
  long lVar6;
  uint uVar7;
  wchar_t slot;
  ulong uVar8;
  char buf [80];
  char local_88 [88];
  
  if (L'\xffffffff' < last) {
    ppoVar1 = player->upkeep->quiver;
    uVar8 = 0;
    do {
      slot = (wchar_t)uVar8;
      if (list == (object **)0x0) {
        obj = slot_object(player,slot);
      }
      else {
        obj = list[uVar8];
      }
      _Var3 = object_test(tester,obj);
      if (_Var3) {
LAB_001f804c:
        if (ppoVar1 == list) {
          uVar7 = slot + L'0';
        }
        else {
          uVar7 = (uint)"abcdefgimnopqrstuvwxyzABCDEFGHIJKLMNOPQRSTUVWXYZ"[uVar8];
        }
        strnfmt(items[num_obj].label,0x50,"%c) ",(ulong)uVar7);
LAB_001f80bc:
        if (list == (object **)0x0) {
          pcVar4 = equip_mention(player,slot);
          sVar5 = utf8_strlen(pcVar4);
          if (sVar5 < 0xe) {
            strnfmt(local_88,0x50,"%s%*s",pcVar4,(ulong)(0xe - (int)sVar5)," ");
          }
          else {
            pcVar4 = string_make(pcVar4);
            if (sVar5 != 0xe) {
              utf8_clipto(pcVar4,0xe);
            }
            strnfmt(local_88,0x50,"%s",pcVar4);
            string_free(pcVar4);
          }
          my_strcpy(items[num_obj].equip_label,local_88,0x50);
        }
        else if ((mode & (OLIST_DEATH|OLIST_WINDOW)) == OLIST_NONE || ppoVar1 != list) {
          strnfmt(items[num_obj].equip_label,0x50,"%s","");
        }
        else {
          strnfmt(local_88,0x50,"Slot %-9d: ",uVar8 & 0xffffffff);
          my_strcpy(items[num_obj].equip_label,local_88,0x50);
        }
        lVar6 = (long)num_obj;
        num_obj = num_obj + L'\x01';
        items[lVar6].object = obj;
        items[lVar6].key = items[lVar6].label[0];
      }
      else {
        if (obj == (object *)0x0) {
          oVar2 = mode & (OLIST_SEMPTY|OLIST_WINDOW);
        }
        else {
          _Var3 = tval_is_money(obj);
          if (((mode & OLIST_GOLD) != OLIST_NONE) && (_Var3)) goto LAB_001f804c;
          oVar2 = mode & OLIST_WINDOW;
        }
        if (oVar2 != OLIST_NONE) {
          my_strcpy(items[num_obj].label,"   ",0x50);
          goto LAB_001f80bc;
        }
      }
      uVar8 = uVar8 + 1;
    } while ((uint)(last + L'\x01') != uVar8);
  }
  return;
}

Assistant:

static void build_obj_list(int last, struct object **list, item_tester tester,
						   olist_detail_t mode)
{
	int i;
	bool gold_ok = (mode & OLIST_GOLD) ? true : false;
	bool in_term = (mode & OLIST_WINDOW) ? true : false;
	bool dead = (mode & OLIST_DEATH) ? true : false;
	bool show_empty = (mode & OLIST_SEMPTY) ? true : false;
	bool equip = list ? false : true;
	bool quiver = list == player->upkeep->quiver ? true : false;

	/* Build the object list */
	for (i = 0; i <= last; i++) {
		char buf[80];
		struct object *obj = equip ? slot_object(player, i) : list[i];

		/* Acceptable items get a label */
		if (object_test(tester, obj) ||	(obj && tval_is_money(obj) && gold_ok))
			strnfmt(items[num_obj].label, sizeof(items[num_obj].label), "%c) ",
				quiver ? I2D(i) : all_letters_nohjkl[i]);

		/* Unacceptable items are still sometimes shown */
		else if ((!obj && show_empty) || in_term)
			my_strcpy(items[num_obj].label, "   ",
					  sizeof(items[num_obj].label));

		/* Unacceptable items are skipped in the main window */
		else continue;

		/* Show full slot labels for equipment (or quiver in subwindow) */
		if (equip) {
			const char *mention = equip_mention(player, i);
			size_t u8len = utf8_strlen(mention);

			if (u8len < 14) {
				strnfmt(buf, sizeof(buf), "%s%*s", mention,
					(int)(14 - u8len), " ");
			} else {
				char *mention_copy = string_make(mention);

				if (u8len > 14) {
					utf8_clipto(mention_copy, 14);
				}
				strnfmt(buf, sizeof(buf), "%s", mention_copy);
				string_free(mention_copy);
			}
			my_strcpy(items[num_obj].equip_label, buf,
					  sizeof(items[num_obj].equip_label));
		} else if ((in_term || dead) && quiver) {
			strnfmt(buf, sizeof(buf), "Slot %-9d: ", i);
			my_strcpy(items[num_obj].equip_label, buf,
					  sizeof(items[num_obj].equip_label));
		} else {
			strnfmt(items[num_obj].equip_label,
				sizeof(items[num_obj].equip_label), "%s", "");
		}

		/* Save the object */
		items[num_obj].object = obj;
		items[num_obj].key = (items[num_obj].label)[0];
		num_obj++;
	}
}